

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_parseAndValidateInvalidUnitIssues_Test::~Validator_parseAndValidateInvalidUnitIssues_Test
          (Validator_parseAndValidateInvalidUnitIssues_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, parseAndValidateInvalidUnitIssues)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"asoiaf\">\n"
        "  <units name=\"ampere\"/>\n"
        "  <units name=\"north\"/>\n"
        "  <units name=\"stark\">\n"
        "    <unit units=\"volt\" prefix=\"mega\" multiplier=\"1000.0\"/>\n"
        "    <unit units=\"north\"/>\n"
        "    <unit units=\"ned\"/>\n"
        "    <unit units=\"king in the north\"/>\n"
        "    <unit prefix=\"wolf\" units=\"metre\"/>\n"
        "  </units>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Units is named 'ampere' which is a protected standard unit name.",
        "Units reference 'ned' in units 'stark' is not a valid reference to a local units or a standard unit type.",
        "Unit in units 'stark' does not have a valid units reference. The reference given is 'king in the north'. CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
        "Prefix 'wolf' of a unit referencing 'metre' in units 'stark' is not a valid integer or an SI prefix.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr m = p->parseModel(in);
    EXPECT_EQ(size_t(0), p->issueCount());

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    v->validateModel(m);
    EXPECT_EQ_ISSUES(expectedIssues, v);
}